

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

gc_heap_ptr<mjs::regexp_object>
mjs::regexp_object::make
          (gc_heap_ptr<mjs::global_object> *global,wstring_view *pattern,regexp_flag flags)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long *plVar5;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  ulong uVar6;
  gc_heap_ptr<mjs::global_object> *args;
  bool bVar7;
  gc_heap_ptr<mjs::regexp_object> gVar8;
  regexp_flag flags_local;
  gc_heap_ptr_untyped local_a0;
  gc_heap_ptr<mjs::global_object> *local_90;
  wstring_view *local_88;
  gc_heap *local_80;
  gc_heap *local_78;
  gc_heap_ptr_untyped local_70;
  wstring res;
  wstring_view local_40;
  
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  args = *(gc_heap_ptr<mjs::global_object> **)((long)pvVar4 + 8);
  plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  (**(code **)(*plVar5 + 0x78))(&local_70,plVar5);
  uVar2 = *(ulong *)CONCAT44(in_register_00000014,flags);
  uVar3 = ((ulong *)CONCAT44(in_register_00000014,flags))[1];
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  if (uVar2 == 0) {
    res._M_dataplus._M_p = (pointer)0x4;
    res._M_string_length = (size_type)anon_var_dwarf_154ac3;
    string::string((string *)&local_a0,*(gc_heap **)((long)pvVar4 + 8),(string_view *)&res);
  }
  else {
    res._M_dataplus._M_p = (pointer)&res.field_2;
    res._M_string_length = 0;
    res.field_2._M_local_buf[0] = L'\0';
    bVar7 = false;
    local_90 = args;
    local_88 = pattern;
    local_80 = (gc_heap *)global;
    local_78 = *(gc_heap **)((long)pvVar4 + 8);
    for (uVar6 = 0; (uVar2 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = *(int *)(uVar3 + uVar6 * 4);
      if (bVar7) {
LAB_0014d61f:
        bVar7 = false;
      }
      else {
        if (iVar1 != 0x5c) {
          if (iVar1 == 0x2f) {
            std::__cxx11::wstring::push_back((wchar_t)&res);
          }
          goto LAB_0014d61f;
        }
        bVar7 = true;
      }
      std::__cxx11::wstring::push_back((wchar_t)&res);
    }
    local_40._M_len = res._M_string_length;
    local_40._M_str = res._M_dataplus._M_p;
    string::string((string *)&local_a0,local_78,&local_40);
    std::__cxx11::wstring::~wstring((wstring *)&res);
    args = local_90;
    global = (gc_heap_ptr<mjs::global_object> *)local_80;
    pattern = local_88;
  }
  gc_heap::
  make<mjs::regexp_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::gc_heap_ptr<mjs::object>,mjs::string,mjs::regexp_flag&>
            ((gc_heap *)global,args,(gc_heap_ptr<mjs::object> *)pattern,(string *)&local_70,
             (regexp_flag *)&local_a0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
  gVar8.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar8.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)global;
  return (gc_heap_ptr<mjs::regexp_object>)gVar8.super_gc_heap_ptr_untyped;
}

Assistant:

static gc_heap_ptr<regexp_object> make(const gc_heap_ptr<global_object>& global, const std::wstring_view& pattern, regexp_flag flags) {
        return global->heap().make<regexp_object>(global, global->regexp_prototype(), get_source_string(global, pattern), flags);
    }